

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O1

dict_itor * wb_dict_itor_new(wb_tree *tree)

{
  dict_itor *pdVar1;
  undefined8 *puVar2;
  
  pdVar1 = (dict_itor *)(*dict_malloc_func)(0x10);
  if (pdVar1 != (dict_itor *)0x0) {
    puVar2 = (undefined8 *)(*dict_malloc_func)(0x10);
    if (puVar2 == (undefined8 *)0x0) {
      pdVar1->_itor = (void *)0x0;
      (*dict_free_func)(pdVar1);
      pdVar1 = (dict_itor *)0x0;
    }
    else {
      *puVar2 = tree;
      puVar2[1] = 0;
      pdVar1->_itor = puVar2;
      pdVar1->_vtable = &wb_tree_itor_vtable;
    }
  }
  return pdVar1;
}

Assistant:

dict_itor*
wb_dict_itor_new(wb_tree* tree)
{
    dict_itor* itor = MALLOC(sizeof(*itor));
    if (itor) {
	if (!(itor->_itor = wb_itor_new(tree))) {
	    FREE(itor);
	    return NULL;
	}
	itor->_vtable = &wb_tree_itor_vtable;
    }
    return itor;
}